

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O1

void __thiscall
VulnerabilityToBin::VulnerabilityToBin
          (VulnerabilityToBin *this,int maxDamageBinIdx,char *binFileName,char *idxFileName,
          bool useIndexFile,bool zip,bool allIntensityBinsCheck)

{
  _Rb_tree_header *p_Var1;
  FILE *pFVar2;
  undefined3 in_register_00000081;
  
  (this->super_ValidateVulnerability).super_Validate.lineno_ = 1;
  (this->super_ValidateVulnerability).super_Validate.warnings_ = false;
  (this->super_ValidateVulnerability).super_Validate.MIN_ID_ = 1;
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d80;
  (this->super_ValidateVulnerability).allIntensityBinsCheck_ = allIntensityBinsCheck;
  (this->super_ValidateVulnerability).convertToBin_ = false;
  (this->super_ValidateVulnerability).useIndexFile_ = false;
  (this->super_ValidateVulnerability).prevVulID_ = 0;
  builtin_strncpy((this->super_ValidateVulnerability).vulIDName_,"Vulnerability",0xe);
  (this->super_ValidateVulnerability).prevDamageBinID_ = 0;
  p_Var1 = &(this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header;
  (this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_ValidateVulnerability).intensityBinIDs_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header
  ;
  (this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_color = _S_red;
  (this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_parent = (_Base_ptr)0x0;
  (this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_left = &p_Var1->_M_header;
  (this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_right = &p_Var1->_M_header;
  (this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  builtin_strncpy((this->super_ValidateVulnerability).super_Validate.fileDescription_,
                  "Vulnerability",0xe);
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d10;
  *(int *)&(this->super_ValidateVulnerability).field_0x30b4 = maxDamageBinIdx;
  this->zip_ = zip;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&(this->vIdx_).size + 4) = 0;
  *(undefined8 *)((long)&(this->vIdx_).original_size + 4) = 0;
  *(undefined8 *)&this->vIdx_ = 0;
  *(undefined8 *)((long)&(this->vIdx_).offset + 4) = 0;
  this->fileOutBin_ = (FILE *)0x0;
  this->fileOutIdx_ = (FILE *)0x0;
  builtin_strncpy((this->super_ValidateVulnerability).super_Validate.fileDescription_,
                  "Vulnerability",0xe);
  (this->super_ValidateVulnerability).convertToBin_ = true;
  (this->super_ValidateVulnerability).useIndexFile_ = useIndexFile;
  if (CONCAT31(in_register_00000081,useIndexFile) == 0) {
    this->fileOutBin_ = _stdout;
  }
  else {
    pFVar2 = fopen(binFileName,"wb");
    this->fileOutBin_ = (FILE *)pFVar2;
    pFVar2 = fopen(idxFileName,"wb");
    this->fileOutIdx_ = (FILE *)pFVar2;
  }
  return;
}

Assistant:

VulnerabilityToBin::VulnerabilityToBin(const int maxDamageBinIdx,
				       const char* binFileName,
				       const char* idxFileName,
				       const bool useIndexFile, const bool zip,
				       const bool allIntensityBinsCheck) :
  ValidateVulnerability(allIntensityBinsCheck),
  maxDamageBinIdx_(maxDamageBinIdx), zip_(zip) {

  strcpy(fileDescription_, "Vulnerability");
  convertToBin_ = true;
  useIndexFile_ = useIndexFile;
  if (useIndexFile_) {
    fileOutBin_ = fopen(binFileName, "wb");
    fileOutIdx_ = fopen(idxFileName, "wb");
  } else {
    fileOutBin_ = stdout;
  }

}